

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttpost.c
# Opt level: O1

FT_Error tt_face_get_ps_name(TT_Face face,FT_UInt idx,FT_String **PSname)

{
  ushort uVar1;
  void *pvVar2;
  long lVar3;
  FT_Error FVar4;
  FT_String *pFVar5;
  
  if (face == (TT_Face)0x0) {
    return 0x23;
  }
  if ((face->max_profile).numGlyphs <= idx) {
    return 0x10;
  }
  pvVar2 = face->psnames;
  if (pvVar2 == (void *)0x0) {
    return 7;
  }
  pFVar5 = (FT_String *)(**(code **)((long)pvVar2 + 0x20))(0);
  *PSname = pFVar5;
  lVar3 = (face->postscript).FormatType;
  if (lVar3 == 0x25000) {
    if (((face->postscript_names).loaded == '\0') && (FVar4 = load_post_names(face), FVar4 != 0)) {
      return 0;
    }
    if ((face->postscript_names).names.format_20.num_glyphs <= idx) {
      return 0;
    }
    idx = (int)*(char *)((long)(face->postscript_names).names.format_20.glyph_indices + (ulong)idx)
          + idx;
  }
  else if (lVar3 == 0x20000) {
    if (((face->postscript_names).loaded == '\0') && (FVar4 = load_post_names(face), FVar4 != 0)) {
      return 0;
    }
    if ((face->postscript_names).names.format_20.num_glyphs <= idx) {
      return 0;
    }
    uVar1 = (face->postscript_names).names.format_20.glyph_indices[idx];
    idx = (FT_UInt)uVar1;
    if (0x101 < uVar1) {
      pFVar5 = (face->postscript_names).names.format_20.glyph_names[(ulong)(uint)uVar1 - 0x102];
      goto LAB_002496c9;
    }
  }
  else {
    if (lVar3 != 0x10000) {
      return 0;
    }
    if (0x101 < idx) {
      return 0;
    }
  }
  pFVar5 = (FT_String *)(**(code **)((long)pvVar2 + 0x20))(idx);
LAB_002496c9:
  *PSname = pFVar5;
  return 0;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_get_ps_name( TT_Face      face,
                       FT_UInt      idx,
                       FT_String**  PSname )
  {
    FT_Error       error;
    TT_Post_Names  names;
    FT_Fixed       format;

#ifdef FT_CONFIG_OPTION_POSTSCRIPT_NAMES
    FT_Service_PsCMaps  psnames;
#endif


    if ( !face )
      return FT_THROW( Invalid_Face_Handle );

    if ( idx >= (FT_UInt)face->max_profile.numGlyphs )
      return FT_THROW( Invalid_Glyph_Index );

#ifdef FT_CONFIG_OPTION_POSTSCRIPT_NAMES
    psnames = (FT_Service_PsCMaps)face->psnames;
    if ( !psnames )
      return FT_THROW( Unimplemented_Feature );
#endif

    names = &face->postscript_names;

    /* `.notdef' by default */
    *PSname = MAC_NAME( 0 );

    format = face->postscript.FormatType;

    if ( format == 0x00010000L )
    {
      if ( idx < 258 )                    /* paranoid checking */
        *PSname = MAC_NAME( idx );
    }
    else if ( format == 0x00020000L )
    {
      TT_Post_20  table = &names->names.format_20;


      if ( !names->loaded )
      {
        error = load_post_names( face );
        if ( error )
          goto End;
      }

      if ( idx < (FT_UInt)table->num_glyphs )
      {
        FT_UShort  name_index = table->glyph_indices[idx];


        if ( name_index < 258 )
          *PSname = MAC_NAME( name_index );
        else
          *PSname = (FT_String*)table->glyph_names[name_index - 258];
      }
    }
    else if ( format == 0x00025000L )
    {
      TT_Post_25  table = &names->names.format_25;


      if ( !names->loaded )
      {
        error = load_post_names( face );
        if ( error )
          goto End;
      }

      if ( idx < (FT_UInt)table->num_glyphs )    /* paranoid checking */
        *PSname = MAC_NAME( (FT_Int)idx + table->offsets[idx] );
    }

    /* nothing to do for format == 0x00030000L */

  End:
    return FT_Err_Ok;
  }